

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

void Mf_ManProfileTruths(Mf_Man_t *p)

{
  int i;
  uint uVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  word *pTruth;
  uint uVar4;
  uint uVar5;
  long lVar6;
  uint i_00;
  long lVar7;
  
  p_00 = Vec_IntStart((p->vCnfSizes).nSize);
  lVar6 = 0xc;
  for (lVar7 = 0; lVar7 < p->pGia->nObjs; lVar7 = lVar7 + 1) {
    pGVar2 = Gia_ManObj(p->pGia,(int)lVar7);
    if (((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) &&
       (0xffff < *(uint *)((long)&p->pLfObjs->iCutSet + lVar6))) {
      piVar3 = Mf_ObjCutSet(p,(int)lVar7);
      i = Abc_Lit2Var((uint)piVar3[1] >> 5);
      Vec_IntAddToEntry(p_00,i,1);
    }
    lVar6 = lVar6 + 0x10;
  }
  uVar4 = p_00->nSize;
  if ((int)uVar4 < 1) {
    uVar4 = 0;
  }
  uVar5 = 0;
  for (i_00 = 0; uVar4 != i_00; i_00 = i_00 + 1) {
    uVar1 = Vec_IntEntry(p_00,i_00);
    if (uVar1 != 0) {
      printf("%6d : ",(ulong)uVar5);
      printf("%6d : ",(ulong)i_00);
      printf("Occur = %4d  ",(ulong)uVar1);
      uVar1 = Vec_IntEntry(&p->vCnfSizes,i_00);
      printf("CNF size = %2d  ",(ulong)uVar1);
      pTruth = Vec_MemReadEntry(p->vTtMem,i_00);
      Dau_DsdPrintFromTruth(pTruth,p->pPars->nLutSize);
      uVar5 = uVar5 + 1;
    }
  }
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Mf_ManProfileTruths( Mf_Man_t * p )
{
    Vec_Int_t * vCounts;
    int i, Entry, * pCut, Counter = 0;
    vCounts = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        Vec_IntAddToEntry( vCounts, Abc_Lit2Var(Mf_CutFunc(pCut)), 1 );
    }
    Vec_IntForEachEntry( vCounts, Entry, i )
    {
        if ( Entry == 0 )
            continue;
        printf( "%6d : ", Counter++ );
        printf( "%6d : ", i );
        printf( "Occur = %4d  ", Entry ); 
        printf( "CNF size = %2d  ", Vec_IntEntry(&p->vCnfSizes, i) );
        Dau_DsdPrintFromTruth( Vec_MemReadEntry(p->vTtMem, i), p->pPars->nLutSize );
    }
    Vec_IntFree( vCounts );
}